

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

int __thiscall QSslSocket::close(QSslSocket *this,int __fd)

{
  long lVar1;
  QAbstractSocket *this_00;
  int extraout_EAX;
  qint64 qVar2;
  
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (*(long **)(lVar1 + 0x408) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x408) + 0xb0))();
  }
  if ((*(char *)(lVar1 + 0x192) == '\0') &&
     ((qVar2 = encryptedBytesToWrite(this), qVar2 != 0 ||
      ((*(long *)(lVar1 + 0x98) != 0 && (*(long *)(*(long *)(lVar1 + 0x98) + 0x18) != 0)))))) {
    QAbstractSocket::flush((QAbstractSocket *)this);
  }
  this_00 = *(QAbstractSocket **)(lVar1 + 0x3f8);
  if (this_00 != (QAbstractSocket *)0x0) {
    if (*(char *)(lVar1 + 0x192) == '\x01') {
      QAbstractSocket::abort(this_00);
    }
    else {
      (**(code **)(*(long *)this_00 + 0x70))();
    }
  }
  QAbstractSocket::close((QAbstractSocket *)this,__fd);
  QIODevicePrivate::QRingBufferRef::clear((QRingBufferRef *)(lVar1 + 0x90));
  QIODevicePrivate::QRingBufferRef::clear((QRingBufferRef *)(lVar1 + 0x98));
  return extraout_EAX;
}

Assistant:

void QSslSocket::close()
{
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::close()";
#endif
    Q_D(QSslSocket);

    // On Windows, CertGetCertificateChain is probably still doing its
    // job, if the socket is re-used, we want to ignore its reported
    // root CA.
    if (auto *backend = d->backend.get())
        backend->cancelCAFetch();

    if (!d->abortCalled && (encryptedBytesToWrite() || !d->writeBuffer.isEmpty()))
        flush();
    if (d->plainSocket) {
        if (d->abortCalled)
            d->plainSocket->abort();
        else
            d->plainSocket->close();
    }
    QTcpSocket::close();

    // must be cleared, reading/writing not possible on closed socket:
    d->buffer.clear();
    d->writeBuffer.clear();
}